

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl.cpp
# Opt level: O1

void __thiscall arbiter::http::Curl::Curl(Curl *this,string *s)

{
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  pointer pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  int iVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first;
  undefined1 *puVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var6;
  pointer pcVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  long *plVar9;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pdVar10;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pdVar11;
  bool bVar12;
  CURL *pCVar13;
  size_type sVar14;
  const_reference pvVar15;
  int *piVar16;
  ostream *poVar17;
  undefined8 uVar18;
  pointer *__ptr;
  long lVar19;
  pointer pbVar20;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v;
  long ret;
  json c;
  Keys ProxyKeys;
  Keys caInfoKeys;
  Keys caPathKeys;
  Keys verifyKeys;
  Keys redirKeys;
  Keys timeoutKeys;
  Keys verboseKeys;
  long *local_2f8;
  json_value local_2f0;
  long local_2e8 [2];
  undefined1 local_2d8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  undefined1 local_2a8 [16];
  undefined1 *local_298 [2];
  undefined1 local_288 [16];
  undefined1 *local_278 [2];
  undefined1 local_268 [16];
  undefined1 *local_258 [2];
  undefined1 local_248 [16];
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_238;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_230;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_228;
  undefined1 local_220 [16];
  undefined1 local_210 [16];
  char local_200 [16];
  input_adapter local_1f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_198;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_180;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_168;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_150;
  _Any_data local_138;
  code *local_128;
  undefined8 uStack_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this->m_curl = (CURL *)0x0;
  this->m_headers = (curl_slist *)0x0;
  this->m_verbose = false;
  this->m_timeout = 5;
  this->m_followRedirect = true;
  this->m_verifyPeer = true;
  this_00 = &this->m_caPath;
  local_230 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&this->m_caInfo;
  local_238 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&this->m_proxy;
  (this->m_caPath)._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  (this->m_caInfo)._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  (this->m_proxy)._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  (this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_228 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)this_00;
  if (s->_M_string_length == 0) {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)local_220,(initializer_list_t)ZEXT816(0),false,object);
  }
  else {
    first._M_current = (s->_M_dataplus)._M_p;
    nlohmann::detail::input_adapter::
    input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
              (&local_1f0,first,
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(first._M_current + s->_M_string_length));
    local_128 = (code *)0x0;
    uStack_120 = 0;
    local_138._M_unused._M_object = (void *)0x0;
    local_138._8_8_ = 0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::parse((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             *)local_220,&local_1f0,(parser_callback_t *)&local_138,true);
    if (local_128 != (code *)0x0) {
      (*local_128)(&local_138,&local_138,__destroy_functor);
    }
    if (local_1f0.ia.
        super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1f0.ia.
                 super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  pCVar13 = (CURL *)curl_easy_init();
  this->m_curl = pCVar13;
  if (local_220[0] != null) {
    pbVar1 = (pointer)(local_2d8 + 0x10);
    local_2d8._0_8_ = pbVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"verbose","");
    local_2f8 = (long *)((ulong)local_2f8 & 0xffffffffffffff00);
    bVar12 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::value<bool,_0>((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                               *)local_220,(key_type *)local_2d8,(bool *)&local_2f8);
    this->m_verbose = bVar12;
    if ((pointer)local_2d8._0_8_ != pbVar1) {
      operator_delete((void *)local_2d8._0_8_);
    }
    local_2d8._0_8_ = pbVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"http","");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)local_210,(initializer_list_t)ZEXT816(0),false,object);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)&local_2f8,(key_type *)local_220,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_2d8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_210);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)(local_210 + 8),local_210[0]);
    if ((pointer)local_2d8._0_8_ != pbVar1) {
      operator_delete((void *)local_2d8._0_8_);
    }
    if ((value_t)local_2f8 != null) {
      sVar14 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::count<char_const(&)[8]>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)&local_2f8,(char (*) [8])"timeout");
      if (sVar14 != 0) {
        pvVar15 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                              *)&local_2f8,"timeout");
        nlohmann::detail::
        get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_long,_0>
                  (pvVar15,(long *)local_2d8);
        this->m_timeout = local_2d8._0_8_;
      }
      sVar14 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::count<char_const(&)[15]>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)&local_2f8,(char (*) [15])"followRedirect");
      if (sVar14 != 0) {
        pvVar15 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                              *)&local_2f8,"followRedirect");
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                  (pvVar15,(boolean_t *)local_2d8);
        this->m_followRedirect = (bool)local_2d8[0];
      }
      sVar14 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::count<char_const(&)[9]>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)&local_2f8,(char (*) [9])"caBundle");
      if (sVar14 == 0) {
        sVar14 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::count<char_const(&)[7]>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)&local_2f8,(char (*) [7])"caPath");
        if (sVar14 != 0) {
          pvVar15 = nlohmann::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                *)&local_2f8,"caPath");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::
          get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_70,pvVar15);
          internal::makeUnique<std::__cxx11::string,std::__cxx11::string&>
                    ((internal *)local_2d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70)
          ;
          uVar18 = local_2d8._0_8_;
          local_2d8._0_8_ = (pointer)0x0;
          ::std::
          __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::reset((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this_00,(pointer)uVar18);
          uVar18 = local_2d8._0_8_;
          if ((pointer)local_2d8._0_8_ != (pointer)0x0) {
            if (*(pointer *)local_2d8._0_8_ != (pointer)(local_2d8._0_8_ + 0x10)) {
              operator_delete(*(pointer *)local_2d8._0_8_);
            }
            operator_delete((void *)uVar18);
          }
          pbVar8 = &local_70;
          goto LAB_0016dee6;
        }
      }
      else {
        pvVar15 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                              *)&local_2f8,"caBundle");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::
        get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_50,pvVar15);
        internal::makeUnique<std::__cxx11::string,std::__cxx11::string&>
                  ((internal *)local_2d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50);
        uVar18 = local_2d8._0_8_;
        local_2d8._0_8_ = (pointer)0x0;
        ::std::
        __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::reset((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00,(pointer)uVar18);
        uVar18 = local_2d8._0_8_;
        if ((pointer)local_2d8._0_8_ != (pointer)0x0) {
          if (*(pointer *)local_2d8._0_8_ != (pointer)(local_2d8._0_8_ + 0x10)) {
            operator_delete(*(pointer *)local_2d8._0_8_);
          }
          operator_delete((void *)uVar18);
        }
        pbVar8 = &local_50;
LAB_0016dee6:
        local_2d8._0_8_ = (pointer)0x0;
        puVar4 = *(undefined1 **)((pbVar8->field_2)._M_local_buf + -0x10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar4 != &pbVar8->field_2) {
          operator_delete(puVar4);
        }
      }
      sVar14 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::count<char_const(&)[7]>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)&local_2f8,(char (*) [7])"caInfo");
      if (sVar14 != 0) {
        pvVar15 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                              *)&local_2f8,"caInfo");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::
        get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_90,pvVar15);
        internal::makeUnique<std::__cxx11::string,std::__cxx11::string&>
                  ((internal *)local_2d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_90);
        uVar18 = local_2d8._0_8_;
        local_2d8._0_8_ = (pointer)0x0;
        ::std::
        __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::reset((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_230,(pointer)uVar18);
        uVar18 = local_2d8._0_8_;
        if ((pointer)local_2d8._0_8_ != (pointer)0x0) {
          if (*(pointer *)local_2d8._0_8_ != (pointer)(local_2d8._0_8_ + 0x10)) {
            operator_delete(*(pointer *)local_2d8._0_8_);
          }
          operator_delete((void *)uVar18);
        }
        local_2d8._0_8_ = (pointer)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
      }
      sVar14 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::count<char_const(&)[6]>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)&local_2f8,(char (*) [6])"Proxy");
      if (sVar14 != 0) {
        pvVar15 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                              *)&local_2f8,"Proxy");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::
        get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_b0,pvVar15);
        internal::makeUnique<std::__cxx11::string,std::__cxx11::string&>
                  ((internal *)local_2d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0);
        uVar18 = local_2d8._0_8_;
        local_2d8._0_8_ = (pointer)0x0;
        ::std::
        __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::reset((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_238,(pointer)uVar18);
        uVar18 = local_2d8._0_8_;
        if ((pointer)local_2d8._0_8_ != (pointer)0x0) {
          if (*(pointer *)local_2d8._0_8_ != (pointer)(local_2d8._0_8_ + 0x10)) {
            operator_delete(*(pointer *)local_2d8._0_8_);
          }
          operator_delete((void *)uVar18);
        }
        local_2d8._0_8_ = (pointer)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
      }
      sVar14 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::count<char_const(&)[11]>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)&local_2f8,(char (*) [11])"verifyPeer");
      if (sVar14 != 0) {
        pvVar15 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                              *)&local_2f8,"verifyPeer");
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                  (pvVar15,(boolean_t *)local_2d8);
        this->m_verifyPeer = (bool)local_2d8[0];
      }
    }
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)&local_2f8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)&local_2f0.boolean,(value_t)local_2f8);
  }
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_2d8 + 0x10);
  local_2d8._0_8_ = pbVar2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"VERBOSE","");
  local_2b8._M_allocated_capacity = (size_type)local_2a8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"CURL_VERBOSE","");
  local_298[0] = local_288;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"ARBITER_VERBOSE","");
  __l._M_len = 3;
  __l._M_array = (iterator)local_2d8;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_150,__l,(allocator_type *)&local_2f8);
  lVar19 = 0;
  do {
    if (local_288 + lVar19 != *(undefined1 **)((long)local_298 + lVar19)) {
      operator_delete(*(undefined1 **)((long)local_298 + lVar19));
    }
    lVar19 = lVar19 + -0x20;
  } while (lVar19 != -0x60);
  local_2d8._0_8_ = pbVar2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"CURL_TIMEOUT","");
  local_2b8._M_allocated_capacity = (size_type)local_2a8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"ARBITER_HTTP_TIMEOUT","");
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_2d8;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_168,__l_00,(allocator_type *)&local_2f8);
  lVar19 = 0;
  do {
    if (local_2a8 + lVar19 != *(undefined1 **)((long)&local_2b8 + lVar19)) {
      operator_delete(*(undefined1 **)((long)&local_2b8 + lVar19));
    }
    lVar19 = lVar19 + -0x20;
  } while (lVar19 != -0x40);
  local_2d8._0_8_ = pbVar2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"CURL_FOLLOWLOCATION","");
  local_2b8._M_allocated_capacity = (size_type)local_2a8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"CURL_FOLLOW_LOCATION","");
  local_298[0] = local_288;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_298,"ARBITER_FOLLOW_LOCATIONARBITER_FOLLOW_REDIRECT","");
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)local_2d8;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_180,__l_01,(allocator_type *)&local_2f8);
  lVar19 = 0;
  do {
    if (local_288 + lVar19 != *(undefined1 **)((long)local_298 + lVar19)) {
      operator_delete(*(undefined1 **)((long)local_298 + lVar19));
    }
    lVar19 = lVar19 + -0x20;
  } while (lVar19 != -0x60);
  local_2d8._0_8_ = pbVar2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"CURL_SSL_VERIFYPEER","");
  local_2b8._M_allocated_capacity = (size_type)local_2a8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"CURL_VERIFY_PEER","");
  local_298[0] = local_288;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"ARBITER_VERIFY_PEER","");
  __l_02._M_len = 3;
  __l_02._M_array = (iterator)local_2d8;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_198,__l_02,(allocator_type *)&local_2f8);
  lVar19 = 0;
  do {
    if (local_288 + lVar19 != *(undefined1 **)((long)local_298 + lVar19)) {
      operator_delete(*(undefined1 **)((long)local_298 + lVar19));
    }
    lVar19 = lVar19 + -0x20;
  } while (lVar19 != -0x60);
  local_2d8._0_8_ = pbVar2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"CURL_CA_PATH","");
  local_2b8._M_allocated_capacity = (size_type)local_2a8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"CURL_CA_BUNDLE","");
  local_298[0] = local_288;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"ARBITER_CA_PATH","");
  __l_03._M_len = 3;
  __l_03._M_array = (iterator)local_2d8;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1b0,__l_03,(allocator_type *)&local_2f8);
  lVar19 = 0;
  do {
    if (local_288 + lVar19 != *(undefined1 **)((long)local_298 + lVar19)) {
      operator_delete(*(undefined1 **)((long)local_298 + lVar19));
    }
    lVar19 = lVar19 + -0x20;
  } while (lVar19 != -0x60);
  local_2d8._0_8_ = pbVar2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"CURL_CAINFO","");
  local_2b8._M_allocated_capacity = (size_type)local_2a8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"CURL_CA_INFO","");
  local_298[0] = local_288;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"ARBITER_CA_INFO","");
  __l_04._M_len = 3;
  __l_04._M_array = (iterator)local_2d8;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1c8,__l_04,(allocator_type *)&local_2f8);
  lVar19 = 0;
  do {
    if (local_288 + lVar19 != *(undefined1 **)((long)local_298 + lVar19)) {
      operator_delete(*(undefined1 **)((long)local_298 + lVar19));
    }
    lVar19 = lVar19 + -0x20;
  } while (lVar19 != -0x60);
  local_2d8._0_8_ = pbVar2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"CURL_PROXY","");
  local_2b8._M_allocated_capacity = (size_type)local_2a8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"HTTP_PROXY","");
  local_298[0] = local_288;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"HTTPS_PROXY","");
  local_278[0] = local_268;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"ALL_PROXY","");
  local_258[0] = local_248;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"ARBITER_PROXY","");
  __l_05._M_len = 5;
  __l_05._M_array = (iterator)local_2d8;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1e0,__l_05,(allocator_type *)&local_2f8);
  lVar19 = 0;
  do {
    if (local_248 + lVar19 != *(undefined1 **)((long)local_258 + lVar19)) {
      operator_delete(*(undefined1 **)((long)local_258 + lVar19));
    }
    lVar19 = lVar19 + -0x20;
  } while (lVar19 != -0xa0);
  bVar12 = local_150.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           local_150.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (!bVar12) {
    pbVar20 = local_150.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      env((arbiter *)local_2d8,pbVar20);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        internal::makeUnique<std::__cxx11::string,std::__cxx11::string&>
                  ((internal *)&local_2f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_2d8._0_8_);
        uVar18 = local_2d8._0_8_;
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*(char **)local_2d8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2d8._0_8_ + 0x10)) {
            operator_delete(*(char **)local_2d8._0_8_);
          }
          operator_delete((void *)uVar18);
        }
        if (!bVar12) goto LAB_0016e5cc;
        break;
      }
      pbVar20 = pbVar20 + 1;
      bVar12 = pbVar20 ==
               local_150.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    } while (!bVar12);
  }
  local_2f8 = (long *)0x0;
LAB_0016e5cc:
  if (local_2f8 != (long *)0x0) {
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*local_2f8;
    piVar16 = __errno_location();
    iVar3 = *piVar16;
    *piVar16 = 0;
    lVar19 = strtol((char *)pbVar5,(char **)local_2d8,10);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8._0_8_ !=
        pbVar5) {
      if (*piVar16 == 0) {
LAB_0016e620:
        *piVar16 = iVar3;
      }
      else if (*piVar16 == 0x22) {
        lVar19 = ::std::__throw_out_of_range("stol");
        goto LAB_0016e620;
      }
      this->m_verbose = lVar19 != 0;
      goto LAB_0016e62d;
    }
    ::std::__throw_invalid_argument("stol");
LAB_0016f022:
    ::std::__throw_invalid_argument("stol");
LAB_0016f02e:
    ::std::__throw_invalid_argument("stol");
    goto LAB_0016f03a;
  }
LAB_0016e62d:
  plVar9 = local_2f8;
  if (local_2f8 != (long *)0x0) {
    if ((long *)*local_2f8 != local_2f8 + 2) {
      operator_delete((long *)*local_2f8);
    }
    operator_delete(plVar9);
  }
  bVar12 = local_168.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           local_168.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (!bVar12) {
    pbVar20 = local_168.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      env((arbiter *)local_2d8,pbVar20);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        internal::makeUnique<std::__cxx11::string,std::__cxx11::string&>
                  ((internal *)&local_2f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_2d8._0_8_);
        uVar18 = local_2d8._0_8_;
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*(char **)local_2d8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2d8._0_8_ + 0x10)) {
            operator_delete(*(char **)local_2d8._0_8_);
          }
          operator_delete((void *)uVar18);
        }
        if (!bVar12) goto LAB_0016e6cd;
        break;
      }
      pbVar20 = pbVar20 + 1;
      bVar12 = pbVar20 ==
               local_168.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    } while (!bVar12);
  }
  local_2f8 = (long *)0x0;
LAB_0016e6cd:
  if (local_2f8 != (long *)0x0) {
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*local_2f8;
    piVar16 = __errno_location();
    iVar3 = *piVar16;
    *piVar16 = 0;
    lVar19 = strtol((char *)pbVar5,(char **)local_2d8,10);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8._0_8_ ==
        pbVar5) goto LAB_0016f022;
    if (*piVar16 == 0) {
LAB_0016e722:
      *piVar16 = iVar3;
    }
    else if (*piVar16 == 0x22) {
      lVar19 = ::std::__throw_out_of_range("stol");
      goto LAB_0016e722;
    }
    this->m_timeout = lVar19;
  }
  plVar9 = local_2f8;
  if (local_2f8 != (long *)0x0) {
    if ((long *)*local_2f8 != local_2f8 + 2) {
      operator_delete((long *)*local_2f8);
    }
    operator_delete(plVar9);
  }
  bVar12 = local_180.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           local_180.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (!bVar12) {
    pbVar20 = local_180.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      env((arbiter *)local_2d8,pbVar20);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        internal::makeUnique<std::__cxx11::string,std::__cxx11::string&>
                  ((internal *)&local_2f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_2d8._0_8_);
        uVar18 = local_2d8._0_8_;
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*(char **)local_2d8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2d8._0_8_ + 0x10)) {
            operator_delete(*(char **)local_2d8._0_8_);
          }
          operator_delete((void *)uVar18);
        }
        if (!bVar12) goto LAB_0016e7cb;
        break;
      }
      pbVar20 = pbVar20 + 1;
      bVar12 = pbVar20 ==
               local_180.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    } while (!bVar12);
  }
  local_2f8 = (long *)0x0;
LAB_0016e7cb:
  if (local_2f8 != (long *)0x0) {
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*local_2f8;
    piVar16 = __errno_location();
    iVar3 = *piVar16;
    *piVar16 = 0;
    lVar19 = strtol((char *)pbVar5,(char **)local_2d8,10);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8._0_8_ ==
        pbVar5) goto LAB_0016f02e;
    if (*piVar16 == 0) {
LAB_0016e820:
      *piVar16 = iVar3;
    }
    else if (*piVar16 == 0x22) {
      lVar19 = ::std::__throw_out_of_range("stol");
      goto LAB_0016e820;
    }
    this->m_followRedirect = lVar19 != 0;
  }
  plVar9 = local_2f8;
  if (local_2f8 != (long *)0x0) {
    if ((long *)*local_2f8 != local_2f8 + 2) {
      operator_delete((long *)*local_2f8);
    }
    operator_delete(plVar9);
  }
  bVar12 = local_198.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           local_198.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (!bVar12) {
    pbVar20 = local_198.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      env((arbiter *)local_2d8,pbVar20);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        internal::makeUnique<std::__cxx11::string,std::__cxx11::string&>
                  ((internal *)&local_2f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_2d8._0_8_);
        uVar18 = local_2d8._0_8_;
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*(char **)local_2d8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2d8._0_8_ + 0x10)) {
            operator_delete(*(char **)local_2d8._0_8_);
          }
          operator_delete((void *)uVar18);
        }
        if (!bVar12) goto LAB_0016e8cd;
        break;
      }
      pbVar20 = pbVar20 + 1;
      bVar12 = pbVar20 ==
               local_198.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    } while (!bVar12);
  }
  local_2f8 = (long *)0x0;
LAB_0016e8cd:
  if (local_2f8 == (long *)0x0) goto LAB_0016e92f;
  pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*local_2f8;
  piVar16 = __errno_location();
  iVar3 = *piVar16;
  *piVar16 = 0;
  lVar19 = strtol((char *)pbVar5,(char **)local_2d8,10);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8._0_8_ == pbVar5
     ) {
LAB_0016f03a:
    uVar18 = ::std::__throw_invalid_argument("stol");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)&local_2f8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)local_220);
    pcVar7 = (this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pcVar7 != (pointer)0x0) {
      operator_delete(pcVar7);
    }
    pdVar10 = local_238;
    if (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_238 !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      ::std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(local_238,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_238)
      ;
    }
    pdVar11 = local_230;
    *(undefined8 *)pdVar10 = 0;
    if (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_230 !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      ::std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(local_230,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_230)
      ;
    }
    pdVar10 = local_228;
    *(undefined8 *)pdVar11 = 0;
    if (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_228 !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      ::std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(local_228,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_228)
      ;
    }
    *(undefined8 *)pdVar10 = 0;
    _Unwind_Resume(uVar18);
  }
  if (*piVar16 == 0) {
LAB_0016e922:
    *piVar16 = iVar3;
  }
  else if (*piVar16 == 0x22) {
    lVar19 = ::std::__throw_out_of_range("stol");
    goto LAB_0016e922;
  }
  this->m_verifyPeer = lVar19 != 0;
LAB_0016e92f:
  plVar9 = local_2f8;
  if (local_2f8 != (long *)0x0) {
    if ((long *)*local_2f8 != local_2f8 + 2) {
      operator_delete((long *)*local_2f8);
    }
    operator_delete(plVar9);
  }
  bVar12 = local_1b0.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           local_1b0.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (!bVar12) {
    pbVar20 = local_1b0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      env((arbiter *)local_2d8,pbVar20);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        internal::makeUnique<std::__cxx11::string,std::__cxx11::string&>
                  ((internal *)&local_2f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_2d8._0_8_);
        uVar18 = local_2d8._0_8_;
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*(char **)local_2d8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2d8._0_8_ + 0x10)) {
            operator_delete(*(char **)local_2d8._0_8_);
          }
          operator_delete((void *)uVar18);
        }
        if (!bVar12) goto LAB_0016e9cf;
        break;
      }
      pbVar20 = pbVar20 + 1;
      bVar12 = pbVar20 ==
               local_1b0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    } while (!bVar12);
  }
  local_2f8 = (long *)0x0;
LAB_0016e9cf:
  if (local_2f8 != (long *)0x0) {
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,*local_2f8,local_2f8[1] + *local_2f8);
    internal::makeUnique<std::__cxx11::string,std::__cxx11::string&>
              ((internal *)local_2d8,&local_d0);
    uVar18 = local_2d8._0_8_;
    local_2d8._0_8_ = (pointer)0x0;
    ::std::
    __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reset((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_228,(pointer)uVar18);
    uVar18 = local_2d8._0_8_;
    if ((pointer)local_2d8._0_8_ != (pointer)0x0) {
      if (*(pointer *)local_2d8._0_8_ != (pointer)(local_2d8._0_8_ + 0x10)) {
        operator_delete(*(pointer *)local_2d8._0_8_);
      }
      operator_delete((void *)uVar18);
    }
    local_2d8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
  }
  plVar9 = local_2f8;
  if (local_2f8 != (long *)0x0) {
    if ((long *)*local_2f8 != local_2f8 + 2) {
      operator_delete((long *)*local_2f8);
    }
    operator_delete(plVar9);
  }
  bVar12 = local_1c8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           local_1c8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (!bVar12) {
    pbVar20 = local_1c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      env((arbiter *)local_2d8,pbVar20);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        internal::makeUnique<std::__cxx11::string,std::__cxx11::string&>
                  ((internal *)&local_2f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_2d8._0_8_);
        uVar18 = local_2d8._0_8_;
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*(char **)local_2d8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2d8._0_8_ + 0x10)) {
            operator_delete(*(char **)local_2d8._0_8_);
          }
          operator_delete((void *)uVar18);
        }
        if (!bVar12) goto LAB_0016eb0c;
        break;
      }
      pbVar20 = pbVar20 + 1;
      bVar12 = pbVar20 ==
               local_1c8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    } while (!bVar12);
  }
  local_2f8 = (long *)0x0;
LAB_0016eb0c:
  if (local_2f8 != (long *)0x0) {
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,*local_2f8,local_2f8[1] + *local_2f8);
    internal::makeUnique<std::__cxx11::string,std::__cxx11::string&>
              ((internal *)local_2d8,&local_f0);
    uVar18 = local_2d8._0_8_;
    local_2d8._0_8_ = (pointer)0x0;
    ::std::
    __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reset((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_230,(pointer)uVar18);
    uVar18 = local_2d8._0_8_;
    if ((pointer)local_2d8._0_8_ != (pointer)0x0) {
      if (*(pointer *)local_2d8._0_8_ != (pointer)(local_2d8._0_8_ + 0x10)) {
        operator_delete(*(pointer *)local_2d8._0_8_);
      }
      operator_delete((void *)uVar18);
    }
    local_2d8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
  }
  plVar9 = local_2f8;
  if (local_2f8 != (long *)0x0) {
    if ((long *)*local_2f8 != local_2f8 + 2) {
      operator_delete((long *)*local_2f8);
    }
    operator_delete(plVar9);
  }
  bVar12 = local_1e0.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           local_1e0.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (!bVar12) {
    pbVar20 = local_1e0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      env((arbiter *)local_2d8,pbVar20);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        internal::makeUnique<std::__cxx11::string,std::__cxx11::string&>
                  ((internal *)&local_2f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_2d8._0_8_);
        uVar18 = local_2d8._0_8_;
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*(char **)local_2d8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2d8._0_8_ + 0x10)) {
            operator_delete(*(char **)local_2d8._0_8_);
          }
          operator_delete((void *)uVar18);
        }
        if (!bVar12) goto LAB_0016ec49;
        break;
      }
      pbVar20 = pbVar20 + 1;
      bVar12 = pbVar20 ==
               local_1e0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    } while (!bVar12);
  }
  local_2f8 = (long *)0x0;
LAB_0016ec49:
  if (local_2f8 != (long *)0x0) {
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_110,*local_2f8,local_2f8[1] + *local_2f8);
    internal::makeUnique<std::__cxx11::string,std::__cxx11::string&>
              ((internal *)local_2d8,&local_110);
    uVar18 = local_2d8._0_8_;
    local_2d8._0_8_ = (pointer)0x0;
    ::std::
    __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reset((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_238,(pointer)uVar18);
    uVar18 = local_2d8._0_8_;
    if ((pointer)local_2d8._0_8_ != (pointer)0x0) {
      if (*(pointer *)local_2d8._0_8_ != (pointer)(local_2d8._0_8_ + 0x10)) {
        operator_delete(*(pointer *)local_2d8._0_8_);
      }
      operator_delete((void *)uVar18);
    }
    local_2d8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
  }
  plVar9 = local_2f8;
  if (local_2f8 != (long *)0x0) {
    if ((long *)*local_2f8 != local_2f8 + 2) {
      operator_delete((long *)*local_2f8);
    }
    operator_delete(plVar9);
  }
  if ((this->m_verbose == true) && (Curl(std::__cxx11::string)::logged == '\0')) {
    Curl(std::__cxx11::string)::logged = '\x01';
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&::std::cout,"Curl config:",0xc)
    ;
    *(uint *)(curl_easy_init + *(long *)(::std::cout + -0x18)) =
         *(uint *)(curl_easy_init + *(long *)(::std::cout + -0x18)) | 1;
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&::std::cout,"\n\ttimeout: ",0xb);
    poVar17 = ::std::ostream::_M_insert<long>((long)&::std::cout);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"s",1);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n\tfollowRedirect: ",0x12);
    poVar17 = ::std::ostream::_M_insert<bool>(SUB81(poVar17,0));
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n\tverifyPeer: ",0xe);
    poVar17 = ::std::ostream::_M_insert<bool>(SUB81(poVar17,0));
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n\tcaBundle: ",0xc);
    _Var6._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         *(tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_228;
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var6._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      local_2d8._0_8_ = pbVar2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"(default)","");
    }
    else {
      local_2d8._0_8_ = pbVar2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_2d8,
                 *(long *)_Var6._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl,
                 *(long *)((long)_Var6._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl + 8) +
                 *(long *)_Var6._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl);
    }
    poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                        (poVar17,(char *)local_2d8._0_8_,local_2d8._8_8_);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n\tcaInfo: ",10);
    _Var6._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         *(tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_230;
    local_2f8 = local_2e8;
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var6._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"(default)","");
    }
    else {
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2f8,
                 *(long *)_Var6._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl,
                 *(long *)((long)_Var6._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl + 8) +
                 *(long *)_Var6._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl);
    }
    poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                        (poVar17,(char *)local_2f8,local_2f0.number_integer);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n\tProxy: ",9);
    _Var6._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         *(tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_238;
    local_210._0_8_ = local_200;
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var6._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"(default)","");
    }
    else {
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_210,
                 *(long *)_Var6._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl,
                 *(long *)((long)_Var6._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl + 8) +
                 *(long *)_Var6._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl);
    }
    poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                        (poVar17,(char *)local_210._0_8_,local_210._8_8_);
    ::std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
    ::std::ostream::put((char)poVar17);
    ::std::ostream::flush();
    if ((char *)local_210._0_8_ != local_200) {
      operator_delete((void *)local_210._0_8_);
    }
    if (local_2f8 != local_2e8) {
      operator_delete(local_2f8);
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8._0_8_ !=
        pbVar2) {
      operator_delete((void *)local_2d8._0_8_);
    }
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1e0);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c8);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1b0);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_198);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_180);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_168);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_150);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_220);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_220 + 8),local_220[0]);
  return;
}

Assistant:

Curl::Curl(const std::string s)
{
#ifdef ARBITER_CURL
    const json c(s.size() ? json::parse(s) : json::object());

    m_curl = curl_easy_init();

    // Configurable entries are:
    //      - timeout           (CURLOPT_LOW_SPEED_TIME)
    //      - followRedirect    (CURLOPT_FOLLOWLOCATION)
    //      - caBundle          (CURLOPT_CAPATH)
    //      - caInfo            (CURLOPT_CAINFO)
    //      - verifyPeer        (CURLOPT_SSL_VERIFYPEER)
    //      - proxy             (CURLOPT_PROXY)

    using Keys = std::vector<std::string>;
    auto find([](const Keys& keys)->std::unique_ptr<std::string>
    {
        for (const auto& key : keys)
        {
            if (auto e = env(key)) return makeUnique<std::string>(*e);
        }
        return std::unique_ptr<std::string>();
    });

    auto mk([](std::string s) { return makeUnique<std::string>(s); });

    if (!c.is_null())
    {
        m_verbose = c.value("verbose", false);
        const auto& h(c.value("http", json::object()));

        if (!h.is_null())
        {
            if (h.count("timeout"))
            {
                m_timeout = h["timeout"].get<long>();
            }

            if (h.count("followRedirect"))
            {
                m_followRedirect = h["followRedirect"].get<bool>();
            }

            if (h.count("caBundle"))
            {
                m_caPath = mk(h["caBundle"].get<std::string>());
            }
            else if (h.count("caPath"))
            {
                m_caPath = mk(h["caPath"].get<std::string>());
            }

            if (h.count("caInfo"))
            {
                m_caInfo = mk(h["caInfo"].get<std::string>());
            }

            if (h.count("Proxy"))
            {
                m_proxy = mk(h["Proxy"].get<std::string>());
            }

            if (h.count("verifyPeer"))
            {
                m_verifyPeer = h["verifyPeer"].get<bool>();
            }
        }
    }

    Keys verboseKeys{ "VERBOSE", "CURL_VERBOSE", "ARBITER_VERBOSE" };
    Keys timeoutKeys{ "CURL_TIMEOUT", "ARBITER_HTTP_TIMEOUT" };
    Keys redirKeys{
        "CURL_FOLLOWLOCATION",
        "CURL_FOLLOW_LOCATION",
        "ARBITER_FOLLOW_LOCATION"
        "ARBITER_FOLLOW_REDIRECT"
    };
    Keys verifyKeys{
        "CURL_SSL_VERIFYPEER",
        "CURL_VERIFY_PEER",
        "ARBITER_VERIFY_PEER"
    };
    Keys caPathKeys{ "CURL_CA_PATH", "CURL_CA_BUNDLE", "ARBITER_CA_PATH" };
    Keys caInfoKeys{ "CURL_CAINFO", "CURL_CA_INFO", "ARBITER_CA_INFO" };
    Keys ProxyKeys{ "CURL_PROXY", "HTTP_PROXY", "HTTPS_PROXY", "ALL_PROXY", "ARBITER_PROXY"};

    if (auto v = find(verboseKeys)) m_verbose = !!std::stol(*v);
    if (auto v = find(timeoutKeys)) m_timeout = std::stol(*v);
    if (auto v = find(redirKeys)) m_followRedirect = !!std::stol(*v);
    if (auto v = find(verifyKeys)) m_verifyPeer = !!std::stol(*v);
    if (auto v = find(caPathKeys)) m_caPath = mk(*v);
    if (auto v = find(caInfoKeys)) m_caInfo = mk(*v);
    if (auto v = find(ProxyKeys)) m_proxy = mk(*v);

    static bool logged(false);
    if (m_verbose && !logged)
    {
        logged = true;
        std::cout << "Curl config:" << std::boolalpha <<
            "\n\ttimeout: " << m_timeout << "s" <<
            "\n\tfollowRedirect: " << m_followRedirect <<
            "\n\tverifyPeer: " << m_verifyPeer <<
            "\n\tcaBundle: " << (m_caPath ? *m_caPath : "(default)") <<
            "\n\tcaInfo: " << (m_caInfo ? *m_caInfo : "(default)") <<
            "\n\tProxy: " << (m_proxy ? *m_proxy : "(default)") <<
            std::endl;
    }
#endif
}